

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endian-util.c
# Opt level: O0

void write_le32(uint32_t val,uchar **buffer)

{
  uchar **buffer_local;
  uint32_t val_local;
  
  **buffer = (uchar)val;
  *buffer = *buffer + 1;
  **buffer = (uchar)(val >> 8);
  *buffer = *buffer + 1;
  **buffer = (uchar)(val >> 0x10);
  *buffer = *buffer + 1;
  **buffer = (uchar)(val >> 0x18);
  *buffer = *buffer + 1;
  return;
}

Assistant:

void write_le32(uint32_t val, unsigned char **buffer)
{
	**(uint8_t **)buffer = (val & 0xff);
	(*buffer) ++;
	**(uint8_t **)buffer = (val & 0xff00) >> 8;
	(*buffer) ++;
	**(uint8_t **)buffer = (val & 0xff0000) >> 16;
	(*buffer) ++;
	**(uint8_t **)buffer = (val & 0xff000000) >> 24;
	(*buffer) ++;
}